

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionContext::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionContext *this,
          OutPoint *outpoint,Amount *amount,
          vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
          *issue_output_list,BlindFactor *blind_factor,BlindFactor *entropy)

{
  pointer *object;
  ByteData *this_00;
  pointer pIVar1;
  undefined8 uVar2;
  bool bVar3;
  uint32_t tx_in_index;
  Script *this_01;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_locking_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_output_amount_list;
  ConfidentialNonce nonce;
  Script script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  undefined1 local_330 [384];
  Address addr;
  
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tx_in_index = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                  _vptr_AbstractTransaction[0xf])(this,outpoint);
  pIVar1 = (issue_output_list->
           super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &((issue_output_list->
              super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
              )._M_impl.super__Vector_impl_data._M_start)->direct_locking_script;
  while (object = &this_01[-0xf].script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish, (pointer)object != pIVar1) {
    core::ConfidentialNonce::ConfidentialNonce(&nonce);
    core::Script::Script(&script);
    bVar3 = core::Script::IsEmpty(this_01);
    if (bVar3) {
      core::Address::Address(&addr);
      this_00 = &this_01[-8].script_data_;
      core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
                ((string *)local_330,(ElementsConfidentialAddress *)this_00);
      uVar2 = local_330._8_8_;
      std::__cxx11::string::~string((string *)local_330);
      if ((pointer)uVar2 == (pointer)0x0) {
        core::Address::operator=(&addr,(Address *)object);
      }
      else {
        core::ElementsConfidentialAddress::GetUnblindedAddress
                  ((Address *)local_330,(ElementsConfidentialAddress *)this_00);
        core::Address::operator=(&addr,(Address *)local_330);
        core::Address::~Address((Address *)local_330);
        if (*(char *)&this_01[1].script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish == '\0') {
          core::ElementsConfidentialAddress::GetConfidentialKey
                    ((ConfidentialKey *)&local_348,(ElementsConfidentialAddress *)this_00);
          core::ConfidentialNonce::ConfidentialNonce
                    ((ConfidentialNonce *)local_330,(Pubkey *)&local_348);
          core::ConfidentialNonce::operator=(&nonce,(ConfidentialNonce *)local_330);
          core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_330);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_348);
        }
      }
      core::Address::GetLockingScript((Script *)local_330,&addr);
      core::Script::operator=(&script,(Script *)local_330);
      core::Script::~Script((Script *)local_330);
      core::Address::~Address(&addr);
    }
    else {
      core::Script::operator=(&script,this_01);
    }
    std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
              (&asset_output_amount_list,(value_type *)(this_01 + 1));
    std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
              (&asset_locking_script_list,&script);
    std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
    push_back(&asset_nonce_list,&nonce);
    core::Script::~Script(&script);
    core::ConfidentialNonce::~ConfidentialNonce(&nonce);
    this_01 = (Script *)&this_01[0x10].script_data_;
  }
  core::ConfidentialTransaction::SetAssetReissuance
            (__return_storage_ptr__,&this->super_ConfidentialTransaction,tx_in_index,amount,
             &asset_output_amount_list,&asset_locking_script_list,&asset_nonce_list,blind_factor,
             entropy);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&asset_nonce_list);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            (&asset_locking_script_list);
  std::_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~_Vector_base
            (&asset_output_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>);
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionContext::SetAssetReissuance(
    const OutPoint& outpoint, const Amount& amount,
    const std::vector<IssuanceOutputParameter>& issue_output_list,
    const BlindFactor& blind_factor, const BlindFactor& entropy) {
  std::vector<Amount> asset_output_amount_list;
  std::vector<Script> asset_locking_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;

  static auto set_func = [](const std::vector<IssuanceOutputParameter>& list,
                            std::vector<Amount>* amount_list,
                            std::vector<Script>* locking_script_list,
                            std::vector<ConfidentialNonce>* nonce_list) {
    for (const auto& data : list) {
      ConfidentialNonce nonce;
      Script script;
      if (!data.direct_locking_script.IsEmpty()) {
        script = data.direct_locking_script;
      } else {
        Address addr;
        if (data.confidential_address.GetAddress().empty()) {
          addr = data.address;
        } else {
          addr = data.confidential_address.GetUnblindedAddress();
          if (!data.is_remove_nonce) {
            nonce = ConfidentialNonce(
                data.confidential_address.GetConfidentialKey());
          }
        }
        script = addr.GetLockingScript();
      }
      amount_list->push_back(data.amount);
      locking_script_list->push_back(script);
      nonce_list->push_back(nonce);
    }
    return;
  };

  uint32_t txin_index = GetTxInIndex(outpoint);
  set_func(
      issue_output_list, &asset_output_amount_list, &asset_locking_script_list,
      &asset_nonce_list);

  return SetAssetReissuance(
      txin_index, amount, asset_output_amount_list, asset_locking_script_list,
      asset_nonce_list, blind_factor, entropy);
}